

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O2

Status __thiscall
google::protobuf::(anonymous_namespace)::
Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
          (_anonymous_namespace_ *this,char *args,
          basic_string_view<char,_std::char_traits<char>_> args_1,char *args_2)

{
  undefined1 local_e0 [80];
  AlphaNum local_90;
  AlphaNum local_60;
  
  local_60.piece_ = absl::lts_20240722::NullSafeStringView("Feature ");
  local_90.piece_._M_len = (size_t)args;
  local_90.piece_._M_str = (char *)args_1._M_len;
  local_e0._32_16_ = (undefined1  [16])absl::lts_20240722::NullSafeStringView(args_1._M_str);
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_e0,&local_60,&local_90);
  absl::lts_20240722::FailedPreconditionError(this,local_e0._8_8_,local_e0._0_8_);
  std::__cxx11::string::~string((string *)local_e0);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status Error(Args... args) {
  return absl::FailedPreconditionError(absl::StrCat(args...));
}